

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_image *
nk_subimage_id(nk_image *__return_storage_ptr__,int id,unsigned_short w,unsigned_short h,nk_rect r)

{
  nk_image *s;
  unsigned_short h_local;
  unsigned_short w_local;
  int id_local;
  nk_rect r_local;
  
  nk_zero(__return_storage_ptr__,0x18);
  (__return_storage_ptr__->handle).id = id;
  __return_storage_ptr__->w = w;
  __return_storage_ptr__->h = h;
  _h_local = r.x;
  __return_storage_ptr__->region[0] = (unsigned_short)(int)_h_local;
  id_local = (int)r.y;
  __return_storage_ptr__->region[1] = (unsigned_short)(int)(float)id_local;
  r_local.x = r.w;
  __return_storage_ptr__->region[2] = (unsigned_short)(int)r_local.x;
  r_local.y = r.h;
  __return_storage_ptr__->region[3] = (unsigned_short)(int)r_local.y;
  return __return_storage_ptr__;
}

Assistant:

NK_API struct nk_image
nk_subimage_id(int id, unsigned short w, unsigned short h, struct nk_rect r)
{
    struct nk_image s;
    nk_zero(&s, sizeof(s));
    s.handle.id = id;
    s.w = w; s.h = h;
    s.region[0] = (unsigned short)r.x;
    s.region[1] = (unsigned short)r.y;
    s.region[2] = (unsigned short)r.w;
    s.region[3] = (unsigned short)r.h;
    return s;
}